

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintestlogger.cpp
# Opt level: O0

int QTest::countSignificantDigits<double>(double num)

{
  qreal divisor;
  int digits;
  double num_local;
  undefined4 local_4;
  
  if (0.0 < num) {
    digits = 0;
    for (divisor = 1.0; 1.0 <= num / divisor; divisor = divisor * 10.0) {
      digits = digits + 1;
    }
    local_4 = digits;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int countSignificantDigits(T num)
    {
        if (num <= 0)
            return 0;

        int digits = 0;
        qreal divisor = 1;

        while (num / divisor >= 1) {
            divisor *= 10;
            ++digits;
        }

        return digits;
    }